

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseExpr(WastParser *this,ExprList *exprs)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  pointer pBVar4;
  pointer pBVar5;
  pointer pIVar6;
  pointer pTVar7;
  __off64_t *in_R8;
  size_t in_R9;
  uint in_stack_fffffffffffff8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_680;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_668;
  Location local_660;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_63a;
  allocator<char> local_639;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  iterator local_618;
  size_type local_610;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_608;
  Enum local_5ec;
  Enum local_5e8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e4;
  allocator<char> local_5e3;
  allocator<char> local_5e2;
  allocator<char> local_5e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  string asStack_5c0 [32];
  string asStack_5a0 [32];
  iterator local_580;
  size_type local_578;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_570;
  Enum local_558;
  Enum local_554;
  undefined1 local_550 [8];
  Var var;
  undefined1 local_4c0 [4];
  TokenType type;
  Enum local_480;
  Enum local_47c;
  Enum local_478;
  Enum local_474;
  Enum local_470;
  Enum local_46c;
  undefined1 local_468 [8];
  __single_object expr_4;
  Token local_420;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_3e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d2;
  allocator<char> local_3d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  iterator local_3b0;
  size_type local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a0;
  Location local_388;
  Enum local_364;
  Location local_360;
  Enum local_33c;
  Location local_338;
  Enum local_318;
  Enum local_314;
  Enum local_310;
  Enum local_30c;
  Location local_308;
  Enum local_2e4;
  iterator local_2e0;
  Enum local_2cc;
  undefined1 local_2c8 [8];
  ExprList cond;
  undefined1 local_2a8 [8];
  __single_object expr_3;
  Token local_260;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_220;
  Enum local_218;
  Enum local_214;
  undefined1 local_210 [8];
  __single_object expr_2;
  Token local_1c8;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_188;
  Enum local_180;
  Enum local_17c;
  undefined1 local_178 [8];
  __single_object expr_1;
  Token local_130;
  undefined1 local_f0 [8];
  Location loc;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c2;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  iterator local_a0;
  size_type local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  Enum local_78;
  Enum local_74;
  uint local_70;
  Enum local_6c;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_68;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> expr;
  ExprList *exprs_local;
  WastParser *this_local;
  
  bVar1 = PeekMatch(this,Lpar,0);
  if (!bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  TVar2 = Peek(this,1);
  bVar1 = anon_unknown_1::IsPlainInstr(TVar2);
  if (bVar1) {
    Consume((Token *)&expr,this);
    std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
    unique_ptr<std::default_delete<wabt::Expr>,void>
              ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_68);
    local_6c = (Enum)ParsePlainInstr(this,&local_68);
    bVar1 = Failed((Result)local_6c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_70 = 1;
    }
    else {
      local_74 = (Enum)ParseExprList(this,exprs);
      bVar1 = Failed((Result)local_74);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_70 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"an expr",&local_c1);
        local_a0 = &local_c0;
        local_98 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_c2);
        __l_02._M_len = local_98;
        __l_02._M_array = local_a0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_90,__l_02,&local_c2);
        local_78 = (Enum)ErrorIfLpar(this,&local_90,(char *)0x0);
        bVar1 = Failed((Result)local_78);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_90);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_c2);
        local_680 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0;
        do {
          local_680 = local_680 + -1;
          std::__cxx11::string::~string((string *)local_680);
        } while (local_680 != &local_c0);
        std::allocator<char>::~allocator(&local_c1);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_70 = 1;
        }
        else {
          std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::unique_ptr
                    ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                     ((long)&loc.field_1 + 8),&local_68);
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                           ((long)&loc.field_1 + 8));
          std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr
                    ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                     ((long)&loc.field_1 + 8));
          local_70 = 0;
        }
      }
    }
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_68);
    if (local_70 != 0) {
      return (Result)this_local._4_4_;
    }
    goto LAB_0027bff4;
  }
  GetLocation((Location *)local_f0,this);
  TVar2 = Peek(this,1);
  if (TVar2 == Block) {
    Consume(&local_130,this);
    Consume((Token *)&expr_1,this);
    std::make_unique<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Location&>((Location *)local_178);
    pBVar4 = std::
             unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
             ::operator->((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                           *)local_178);
    local_17c = (Enum)ParseLabelOpt(this,&(pBVar4->block).label);
    bVar1 = Failed((Result)local_17c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_70 = 1;
    }
    else {
      pBVar4 = std::
               unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
               ::operator->((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                             *)local_178);
      local_180 = (Enum)ParseBlock(this,&pBVar4->block);
      bVar1 = Failed((Result)local_180);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_70 = 1;
      }
      else {
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
        unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>>,void>
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_188,
                   (unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                    *)local_178);
        intrusive_list<wabt::Expr>::push_back(exprs,&local_188);
        std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_188);
        local_70 = 8;
      }
    }
    std::
    unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
    ::~unique_ptr((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)8>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)8>_>_>
                   *)local_178);
  }
  else if (TVar2 == If) {
    Consume(&local_260,this);
    Consume((Token *)&expr_3,this);
    std::make_unique<wabt::IfExpr,wabt::Location&>((Location *)local_2a8);
    pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                       ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)local_2a8);
    cond.size_._4_4_ = ParseLabelOpt(this,&(pIVar6->true_).label);
    bVar1 = Failed(cond.size_._4_4_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_70 = 1;
    }
    else {
      pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                         ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)local_2a8)
      ;
      cond.size_._0_4_ = ParseBlockDeclaration(this,&(pIVar6->true_).decl);
      bVar1 = Failed(cond.size_._0_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_70 = 1;
      }
      else {
        bVar1 = PeekMatchExpr(this);
        if (bVar1) {
          intrusive_list<wabt::Expr>::intrusive_list((intrusive_list<wabt::Expr> *)local_2c8);
          local_2cc = (Enum)ParseExpr(this,(ExprList *)local_2c8);
          bVar1 = Failed((Result)local_2cc);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            local_2e0 = intrusive_list<wabt::Expr>::end(exprs);
            intrusive_list<wabt::Expr>::splice
                      (exprs,(int)local_2e0.list_,(__off64_t *)local_2e0.node_,(int)local_2c8,in_R8,
                       in_R9,in_stack_fffffffffffff8c8);
          }
          local_70 = (uint)bVar1;
          intrusive_list<wabt::Expr>::~intrusive_list((intrusive_list<wabt::Expr> *)local_2c8);
          if (local_70 != 0) goto LAB_0027b837;
        }
        bVar1 = MatchLpar(this,Then);
        if (bVar1) {
          pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                             ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                              local_2a8);
          local_2e4 = (Enum)ParseTerminatingInstrList(this,&(pIVar6->true_).exprs);
          bVar1 = Failed((Result)local_2e4);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_70 = 1;
          }
          else {
            GetLocation(&local_308,this);
            pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                               ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                                local_2a8);
            (pIVar6->true_).end_loc.filename._M_len = local_308.filename._M_len;
            (pIVar6->true_).end_loc.filename._M_str = local_308.filename._M_str;
            (pIVar6->true_).end_loc.field_1.field_1.offset =
                 (size_t)local_308.field_1.field_1.offset;
            *(undefined8 *)((long)&(pIVar6->true_).end_loc.field_1 + 8) = local_308.field_1._8_8_;
            local_30c = (Enum)Expect(this,Rpar);
            bVar1 = Failed((Result)local_30c);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_70 = 1;
            }
            else {
              bVar1 = MatchLpar(this,Else);
              if (!bVar1) {
                bVar1 = PeekMatchExpr(this);
                if (bVar1) {
                  pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::
                           operator->((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>
                                       *)local_2a8);
                  local_318 = (Enum)ParseExpr(this,&pIVar6->false_);
                  bVar1 = Failed((Result)local_318);
                  if (bVar1) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    local_70 = 1;
                    goto LAB_0027b837;
                  }
                }
LAB_0027b4f6:
                GetLocation(&local_338,this);
                pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::
                         operator->((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                                    local_2a8);
                (pIVar6->false_end_loc).filename._M_len = local_338.filename._M_len;
                (pIVar6->false_end_loc).filename._M_str = local_338.filename._M_str;
                (pIVar6->false_end_loc).field_1.field_1.offset =
                     (size_t)local_338.field_1.field_1.offset;
                *(undefined8 *)((long)&(pIVar6->false_end_loc).field_1 + 8) =
                     local_338.field_1._8_8_;
                goto LAB_0027b7f3;
              }
              pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                                 ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                                  local_2a8);
              local_310 = (Enum)ParseTerminatingInstrList(this,&pIVar6->false_);
              bVar1 = Failed((Result)local_310);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                local_70 = 1;
              }
              else {
                local_314 = (Enum)Expect(this,Rpar);
                bVar1 = Failed((Result)local_314);
                if (!bVar1) goto LAB_0027b4f6;
                Result::Result((Result *)((long)&this_local + 4),Error);
                local_70 = 1;
              }
            }
          }
        }
        else {
          bVar1 = PeekMatchExpr(this);
          if (bVar1) {
            pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                               ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                                local_2a8);
            local_33c = (Enum)ParseExpr(this,&(pIVar6->true_).exprs);
            bVar1 = Failed((Result)local_33c);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_70 = 1;
            }
            else {
              GetLocation(&local_360,this);
              pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::operator->
                                 ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                                  local_2a8);
              (pIVar6->true_).end_loc.filename._M_len = local_360.filename._M_len;
              (pIVar6->true_).end_loc.filename._M_str = local_360.filename._M_str;
              (pIVar6->true_).end_loc.field_1.field_1.offset =
                   (size_t)local_360.field_1.field_1.offset;
              *(undefined8 *)((long)&(pIVar6->true_).end_loc.field_1 + 8) = local_360.field_1._8_8_;
              bVar1 = PeekMatchExpr(this);
              if (bVar1) {
                pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::
                         operator->((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                                    local_2a8);
                local_364 = (Enum)ParseExpr(this,&pIVar6->false_);
                bVar1 = Failed((Result)local_364);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  local_70 = 1;
                  goto LAB_0027b837;
                }
                GetLocation(&local_388,this);
                pIVar6 = std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::
                         operator->((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)
                                    local_2a8);
                (pIVar6->false_end_loc).filename._M_len = local_388.filename._M_len;
                (pIVar6->false_end_loc).filename._M_str = local_388.filename._M_str;
                (pIVar6->false_end_loc).field_1.field_1.offset =
                     (size_t)local_388.field_1.field_1.offset;
                *(undefined8 *)((long)&(pIVar6->false_end_loc).field_1 + 8) =
                     local_388.field_1._8_8_;
              }
LAB_0027b7f3:
              std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
              unique_ptr<wabt::IfExpr,std::default_delete<wabt::IfExpr>,void>
                        ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_3e0,
                         (unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)local_2a8);
              intrusive_list<wabt::Expr>::push_back(exprs,&local_3e0);
              std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_3e0)
              ;
              local_70 = 8;
            }
          }
          else {
            ConsumeIfLpar(this);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3d0,"then block",&local_3d1);
            local_3b0 = &local_3d0;
            local_3a8 = 1;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator(&local_3d2);
            __l_01._M_len = local_3a8;
            __l_01._M_array = local_3b0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_3a0,__l_01,&local_3d2);
            this_local._4_4_ = ErrorExpected(this,&local_3a0,"(then ...)");
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_3a0);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator(&local_3d2);
            local_6c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_3b0;
            do {
              local_6c8 = local_6c8 + -1;
              std::__cxx11::string::~string((string *)local_6c8);
            } while (local_6c8 != &local_3d0);
            std::allocator<char>::~allocator(&local_3d1);
            local_70 = 1;
          }
        }
      }
    }
LAB_0027b837:
    std::unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_>::~unique_ptr
              ((unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> *)local_2a8);
  }
  else if (TVar2 == Loop) {
    Consume(&local_1c8,this);
    Consume((Token *)&expr_2,this);
    std::make_unique<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Location&>((Location *)local_210)
    ;
    pBVar5 = std::
             unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
             ::operator->((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
                           *)local_210);
    local_214 = (Enum)ParseLabelOpt(this,&(pBVar5->block).label);
    bVar1 = Failed((Result)local_214);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_70 = 1;
    }
    else {
      pBVar5 = std::
               unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
               ::operator->((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
                             *)local_210);
      local_218 = (Enum)ParseBlock(this,&pBVar5->block);
      bVar1 = Failed((Result)local_218);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_70 = 1;
      }
      else {
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
        unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>>,void>
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_220,
                   (unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
                    *)local_210);
        intrusive_list<wabt::Expr>::push_back(exprs,&local_220);
        std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_220);
        local_70 = 8;
      }
    }
    std::
    unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
    ::~unique_ptr((unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
                   *)local_210);
  }
  else {
    if (TVar2 != Try) {
      __assert_fail("!\"ParseExpr should only be called when IsExpr() is true\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                    ,0xc0f,"Result wabt::WastParser::ParseExpr(ExprList *)");
    }
    Consume(&local_420,this);
    Consume((Token *)&expr_4,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&expr_4);
    std::make_unique<wabt::TryExpr,wabt::Location&>((Location *)local_468);
    pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                       ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)local_468)
    ;
    local_46c = (Enum)ParseLabelOpt(this,&(pTVar7->block).label);
    bVar1 = Failed((Result)local_46c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_70 = 1;
    }
    else {
      pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                         ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                          local_468);
      local_470 = (Enum)ParseBlockDeclaration(this,&(pTVar7->block).decl);
      bVar1 = Failed((Result)local_470);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_70 = 1;
      }
      else {
        local_474 = (Enum)Expect(this,Lpar);
        bVar1 = Failed((Result)local_474);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_70 = 1;
        }
        else {
          local_478 = (Enum)Expect(this,Do);
          bVar1 = Failed((Result)local_478);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_70 = 1;
          }
          else {
            pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::operator->
                               ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                                local_468);
            local_47c = (Enum)ParseInstrList(this,&(pTVar7->block).exprs);
            bVar1 = Failed((Result)local_47c);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_70 = 1;
            }
            else {
              local_480 = (Enum)Expect(this,Rpar);
              bVar1 = Failed((Result)local_480);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                local_70 = 1;
              }
              else {
                bVar1 = PeekMatch(this,Lpar,0);
                if (bVar1) {
                  Consume((Token *)local_4c0,this);
                  TVar2 = Peek(this,0);
                  if (TVar2 == Delegate) {
                    Consume((Token *)((long)&var.field_2 + 0x18),this);
                    Var::Var((Var *)local_550);
                    local_554 = (Enum)ParseVar(this,(Var *)local_550);
                    bVar1 = Failed((Result)local_554);
                    if (bVar1) {
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      local_70 = 1;
                    }
                    else {
                      pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                               operator->((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>
                                           *)local_468);
                      Var::operator=(&pTVar7->delegate_target,(Var *)local_550);
                      pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                               operator->((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>
                                           *)local_468);
                      pTVar7->kind = Delegate;
                      local_558 = (Enum)Expect(this,Rpar);
                      bVar1 = Failed((Result)local_558);
                      if (bVar1) {
                        Result::Result((Result *)((long)&this_local + 4),Error);
                        local_70 = 1;
                      }
                      else {
                        local_70 = 0x31;
                      }
                    }
                    Var::~Var((Var *)local_550);
                    if (local_70 != 0x31) goto LAB_0027bfbb;
                  }
                  else if (TVar2 == Catch || TVar2 == CatchAll) {
                    pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                             operator->((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>
                                         *)local_468);
                    RVar3 = ParseCatchExprList(this,&pTVar7->catches);
                    bVar1 = Failed(RVar3);
                    if (bVar1) {
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      local_70 = 1;
                      goto LAB_0027bfbb;
                    }
                    pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                             operator->((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>
                                         *)local_468);
                    pTVar7->kind = Catch;
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_5e0,"catch",&local_5e1);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (asStack_5c0,"catch_all",&local_5e2);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (asStack_5a0,"delegate",&local_5e3);
                    local_580 = &local_5e0;
                    local_578 = 3;
                    std::
                    allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::allocator(&local_5e4);
                    __l_00._M_len = local_578;
                    __l_00._M_array = local_580;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_570,__l_00,&local_5e4);
                    local_5e8 = (Enum)ErrorExpected(this,&local_570,(char *)0x0);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_570);
                    std::
                    allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~allocator(&local_5e4);
                    local_6f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_580;
                    do {
                      local_6f0 = local_6f0 + -1;
                      std::__cxx11::string::~string((string *)local_6f0);
                    } while (local_6f0 != &local_5e0);
                    std::allocator<char>::~allocator(&local_5e3);
                    std::allocator<char>::~allocator(&local_5e2);
                    std::allocator<char>::~allocator(&local_5e1);
                  }
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_638,"a valid try clause",&local_639);
                local_618 = &local_638;
                local_610 = 1;
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::allocator(&local_63a);
                __l._M_len = local_610;
                __l._M_array = local_618;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_608,__l,&local_63a);
                local_5ec = (Enum)ErrorIfLpar(this,&local_608,(char *)0x0);
                bVar1 = Failed((Result)local_5ec);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_608);
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~allocator(&local_63a);
                local_718 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_618;
                do {
                  local_718 = local_718 + -1;
                  std::__cxx11::string::~string((string *)local_718);
                } while (local_718 != &local_638);
                std::allocator<char>::~allocator(&local_639);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  local_70 = 1;
                }
                else {
                  GetLocation(&local_660,this);
                  pTVar7 = std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::
                           operator->((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>
                                       *)local_468);
                  (pTVar7->block).end_loc.filename._M_len = local_660.filename._M_len;
                  (pTVar7->block).end_loc.filename._M_str = local_660.filename._M_str;
                  (pTVar7->block).end_loc.field_1.field_1.offset =
                       (size_t)local_660.field_1.field_1.offset;
                  *(undefined8 *)((long)&(pTVar7->block).end_loc.field_1 + 8) =
                       local_660.field_1._8_8_;
                  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
                  unique_ptr<wabt::TryExpr,std::default_delete<wabt::TryExpr>,void>
                            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_668,
                             (unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)
                             local_468);
                  intrusive_list<wabt::Expr>::push_back(exprs,&local_668);
                  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr
                            (&local_668);
                  local_70 = 8;
                }
              }
            }
          }
        }
      }
    }
LAB_0027bfbb:
    std::unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>::~unique_ptr
              ((unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> *)local_468);
  }
  if (local_70 == 1) {
    return (Result)this_local._4_4_;
  }
LAB_0027bff4:
  RVar3 = Expect(this,Rpar);
  bVar1 = Failed(RVar3);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseExpr(ExprList* exprs) {
  WABT_TRACE(ParseExpr);
  if (!PeekMatch(TokenType::Lpar)) {
    return Result::Error;
  }

  if (IsPlainInstr(Peek(1))) {
    Consume();
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    CHECK_RESULT(ParseExprList(exprs));
    CHECK_RESULT(ErrorIfLpar({"an expr"}));
    exprs->push_back(std::move(expr));
  } else {
    Location loc = GetLocation();

    switch (Peek(1)) {
      case TokenType::Block: {
        Consume();
        Consume();
        auto expr = std::make_unique<BlockExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Loop: {
        Consume();
        Consume();
        auto expr = std::make_unique<LoopExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::If: {
        Consume();
        Consume();
        auto expr = std::make_unique<IfExpr>(loc);

        CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));

        if (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        if (MatchLpar(TokenType::Then)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          EXPECT(Rpar);

          if (MatchLpar(TokenType::Else)) {
            CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
            EXPECT(Rpar);
          } else if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
          }
          expr->false_end_loc = GetLocation();
        } else if (PeekMatchExpr()) {
          CHECK_RESULT(ParseExpr(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
            expr->false_end_loc = GetLocation();
          }
        } else {
          ConsumeIfLpar();
          return ErrorExpected({"then block"}, "(then ...)");
        }

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Try: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());

        auto expr = std::make_unique<TryExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        EXPECT(Lpar);
        EXPECT(Do);
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        EXPECT(Rpar);
        if (PeekMatch(TokenType::Lpar)) {
          Consume();
          TokenType type = Peek();
          switch (type) {
            case TokenType::Catch:
            case TokenType::CatchAll:
              CHECK_RESULT(ParseCatchExprList(&expr->catches));
              expr->kind = TryKind::Catch;
              break;
            case TokenType::Delegate: {
              Consume();
              Var var;
              CHECK_RESULT(ParseVar(&var));
              expr->delegate_target = var;
              expr->kind = TryKind::Delegate;
              EXPECT(Rpar);
              break;
            }
            default:
              ErrorExpected({"catch", "catch_all", "delegate"});
              break;
          }
        }
        CHECK_RESULT(ErrorIfLpar({"a valid try clause"}));
        expr->block.end_loc = GetLocation();
        exprs->push_back(std::move(expr));
        break;
      }

      default:
        assert(!"ParseExpr should only be called when IsExpr() is true");
        return Result::Error;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}